

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidySetErrorSink(TidyDoc tdoc,TidyOutputSink *sink)

{
  uint nl;
  int iVar1;
  StreamOut *pSVar2;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    nl = tdoc[0x8e]._opaque;
    iVar1 = tdoc[0x94]._opaque;
    prvTidyReleaseStreamOut((TidyDocImpl *)tdoc,*(StreamOut **)(tdoc + 0xcfa));
    pSVar2 = prvTidyUserOutput((TidyDocImpl *)tdoc,sink,iVar1,nl);
    *(StreamOut **)(tdoc + 0xcfa) = pSVar2;
    iVar1 = -0xc;
    if (pSVar2 != (StreamOut *)0x0) {
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int TIDY_CALL    tidySetErrorSink( TidyDoc tdoc, TidyOutputSink* sink )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        uint outenc = cfg( impl, TidyOutCharEncoding );
        uint nl = cfg( impl, TidyNewline );
        TY_(ReleaseStreamOut)( impl, impl->errout );
        impl->errout = TY_(UserOutput)( impl, sink, outenc, nl );
        return ( impl->errout ? 0 : -ENOMEM );
    }
    return -EINVAL;
}